

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pipeline_layout
          (Impl *this,VkPipelineLayoutCreateInfo *create_info,ScratchAllocator *alloc,
          VkPipelineLayoutCreateInfo **out_create_info)

{
  void *pvVar1;
  VkPushConstantRange *__src;
  VkDescriptorSetLayout *__src_00;
  void *pvVar2;
  undefined4 uVar3;
  VkPipelineLayoutCreateFlags VVar4;
  uint32_t uVar5;
  VkStructureType VVar6;
  undefined4 uVar7;
  VkPipelineLayoutCreateInfo *pVVar8;
  VkPushConstantRange *pVVar9;
  VkDescriptorSetLayout *ppVVar10;
  size_t sVar11;
  
  pvVar1 = create_info->pNext;
  if (pvVar1 == (void *)0x0) {
    pVVar8 = (VkPipelineLayoutCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x30,0x10);
    if (pVVar8 != (VkPipelineLayoutCreateInfo *)0x0) {
      VVar6 = create_info->sType;
      uVar7 = *(undefined4 *)&create_info->field_0x4;
      pvVar2 = create_info->pNext;
      VVar4 = create_info->flags;
      uVar5 = create_info->setLayoutCount;
      ppVVar10 = create_info->pSetLayouts;
      uVar3 = *(undefined4 *)&create_info->field_0x24;
      pVVar9 = create_info->pPushConstantRanges;
      pVVar8->pushConstantRangeCount = create_info->pushConstantRangeCount;
      *(undefined4 *)&pVVar8->field_0x24 = uVar3;
      pVVar8->pPushConstantRanges = pVVar9;
      pVVar8->flags = VVar4;
      pVVar8->setLayoutCount = uVar5;
      pVVar8->pSetLayouts = ppVVar10;
      pVVar8->sType = VVar6;
      *(undefined4 *)&pVVar8->field_0x4 = uVar7;
      pVVar8->pNext = pvVar2;
    }
    if ((ulong)pVVar8->pushConstantRangeCount == 0) {
      pVVar9 = (VkPushConstantRange *)0x0;
    }
    else {
      __src = pVVar8->pPushConstantRanges;
      sVar11 = (ulong)pVVar8->pushConstantRangeCount * 0xc;
      pVVar9 = (VkPushConstantRange *)ScratchAllocator::allocate_raw(alloc,sVar11,0x10);
      if (pVVar9 != (VkPushConstantRange *)0x0) {
        memmove(pVVar9,__src,sVar11);
      }
    }
    pVVar8->pPushConstantRanges = pVVar9;
    if ((ulong)pVVar8->setLayoutCount == 0) {
      ppVVar10 = (VkDescriptorSetLayout *)0x0;
    }
    else {
      __src_00 = pVVar8->pSetLayouts;
      sVar11 = (ulong)pVVar8->setLayoutCount << 3;
      ppVVar10 = (VkDescriptorSetLayout *)ScratchAllocator::allocate_raw(alloc,sVar11,0x10);
      if (ppVVar10 != (VkDescriptorSetLayout *)0x0) {
        memmove(ppVVar10,__src_00,sVar11);
      }
    }
    pVVar8->pSetLayouts = ppVVar10;
    *out_create_info = pVVar8;
  }
  return pvVar1 == (void *)0x0;
}

Assistant:

bool StateRecorder::Impl::copy_pipeline_layout(const VkPipelineLayoutCreateInfo *create_info, ScratchAllocator &alloc,
                                               VkPipelineLayoutCreateInfo **out_create_info)
{
	if (create_info->pNext)
		return false;

	auto *info = copy(create_info, 1, alloc);
	info->pPushConstantRanges = copy(info->pPushConstantRanges, info->pushConstantRangeCount, alloc);
	info->pSetLayouts = copy(info->pSetLayouts, info->setLayoutCount, alloc);

	*out_create_info = info;
	return true;
}